

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventID.h
# Opt level: O1

void __thiscall DIS::CollisionPdu::setEventID(CollisionPdu *this,EventID *pX)

{
  unsigned_short uVar1;
  
  (this->_eventID)._eventNumber = pX->_eventNumber;
  uVar1 = pX->_application;
  (this->_eventID)._site = pX->_site;
  (this->_eventID)._application = uVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT EventID
{
protected:
  /** The site ID */
  unsigned short _site; 

  /** The application ID */
  unsigned short _application; 

  /** the number of the event */
  unsigned short _eventNumber; 


 public:
    EventID();
    virtual ~EventID();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getSite() const; 
    void setSite(unsigned short pX); 

    unsigned short getApplication() const; 
    void setApplication(unsigned short pX); 

    unsigned short getEventNumber() const; 
    void setEventNumber(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EventID& rhs) const;
}